

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_UnknownFieldsAll_Test::TestBody
          (ComparisonTest_UnknownFieldsAll_Test *this)

{
  bool bVar1;
  UnknownFieldSet *pUVar2;
  UnknownField *this_00;
  char *message;
  AssertHelper local_70;
  Message local_68 [3];
  string local_50;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  ComparisonTest_UnknownFieldsAll_Test *this_local;
  
  UnknownFieldSet::AddVarint((this->super_ComparisonTest).unknown1_,0xf3,0x7a);
  UnknownFieldSet::AddFixed64((this->super_ComparisonTest).unknown1_,0xf4,0x172356);
  UnknownFieldSet::AddFixed64((this->super_ComparisonTest).unknown1_,0xf4,0x98);
  pUVar2 = UnknownFieldSet::AddGroup((this->super_ComparisonTest).unknown1_,0xf5);
  UnknownFieldSet::AddFixed32(pUVar2,0xf8,1);
  this_00 = UnknownFieldSet::mutable_field((this->super_ComparisonTest).unknown1_,3);
  pUVar2 = UnknownField::mutable_group(this_00);
  UnknownFieldSet::AddFixed32(pUVar2,0xf8,2);
  pUVar2 = UnknownFieldSet::AddGroup((this->super_ComparisonTest).unknown1_,0xf9);
  UnknownFieldSet::AddFixed64(pUVar2,0xfa,1);
  UnknownFieldSet::AddVarint((this->super_ComparisonTest).unknown2_,0xf3,0x79);
  pUVar2 = (this->super_ComparisonTest).unknown2_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_,"test 123");
  UnknownFieldSet::AddLengthDelimited(pUVar2,0x1209a,stack0xffffffffffffffe0);
  pUVar2 = UnknownFieldSet::AddGroup((this->super_ComparisonTest).unknown2_,0xf5);
  UnknownFieldSet::AddFixed32(pUVar2,0xf8,3);
  UnknownFieldSet::AddGroup((this->super_ComparisonTest).unknown2_,0xf7);
  protobuf::(anonymous_namespace)::ComparisonTest::RunUn_abi_cxx11_(&local_50,this);
  testing::internal::EqHelper::
  Compare<char[263],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_30,
             "\"modified: 243[0]: 122 -> 121\\n\" \"deleted: 244[0]: 0x0000000000172356\\n\" \"deleted: 244[1]: 0x0000000000000098\\n\" \"modified: 245[0].248[0]: 0x00000001 -> 0x00000003\\n\" \"deleted: 245[0].248[1]: 0x00000002\\n\" \"added: 247[0]: { ... }\\n\" \"deleted: 249[0]: { ... }\\n\" \"added: 73882[0]: \\\"test 123\\\"\\n\""
             ,"RunUn()",
             (char (*) [263])
             "modified: 243[0]: 122 -> 121\ndeleted: 244[0]: 0x0000000000172356\ndeleted: 244[1]: 0x0000000000000098\nmodified: 245[0].248[0]: 0x00000001 -> 0x00000003\ndeleted: 245[0].248[1]: 0x00000002\nadded: 247[0]: { ... }\ndeleted: 249[0]: { ... }\nadded: 73882[0]: \"test 123\"\n"
             ,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_68);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xed1,message);
    testing::internal::AssertHelper::operator=(&local_70,local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  return;
}

Assistant:

TEST_F(ComparisonTest, UnknownFieldsAll) {
  unknown1_->AddVarint(243, 122);
  unknown1_->AddFixed64(244, 0x0172356);
  unknown1_->AddFixed64(244, 0x098);
  unknown1_->AddGroup(245)->AddFixed32(248, 1);
  unknown1_->mutable_field(3)->mutable_group()->AddFixed32(248, 2);
  unknown1_->AddGroup(249)->AddFixed64(250, 1);

  unknown2_->AddVarint(243, 121);
  unknown2_->AddLengthDelimited(73882, "test 123");
  unknown2_->AddGroup(245)->AddFixed32(248, 3);
  unknown2_->AddGroup(247);

  EXPECT_EQ(
      "modified: 243[0]: 122 -> 121\n"
      "deleted: 244[0]: 0x0000000000172356\n"
      "deleted: 244[1]: 0x0000000000000098\n"
      "modified: 245[0].248[0]: 0x00000001 -> 0x00000003\n"
      "deleted: 245[0].248[1]: 0x00000002\n"
      "added: 247[0]: { ... }\n"
      "deleted: 249[0]: { ... }\n"
      "added: 73882[0]: \"test 123\"\n",
      RunUn());
}